

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::FinalizeObject(markerType *marker,char *base)

{
  uint uVar1;
  ExternTypeInfo *pEVar2;
  uint local_48;
  undefined1 local_44 [8];
  NULLCRef r_1;
  uint i;
  NULLCRef r;
  uint count;
  uint arrayPadding;
  ExternTypeInfo *typeInfo;
  char *base_local;
  markerType *marker_local;
  
  if ((*marker & OBJECT_ARRAY) == 0) {
    local_44._0_4_ = (uint)(*marker >> 8) & 0xffffff;
    register0x00000000 = base + 8;
    FastVector<NULLCRef,_false,_false>::push_back
              ((FastVector<NULLCRef,_false,_false> *)&finalizeList,(NULLCRef *)local_44);
  }
  else {
    pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        (uint)(*marker >> 8) & 0xffffff);
    if (pEVar2->defaultAlign < 5) {
      local_48 = 4;
    }
    else {
      local_48 = (uint)pEVar2->defaultAlign;
    }
    uVar1 = *(uint *)(base + (ulong)local_48 + 4);
    r_1.ptr._4_4_ = (uint)(*marker >> 8) & 0xffffff;
    for (r_1.ptr._0_4_ = 0; (uint)r_1.ptr < uVar1; r_1.ptr._0_4_ = (uint)r_1.ptr + 1) {
      FastVector<NULLCRef,_false,_false>::push_back
                ((FastVector<NULLCRef,_false,_false> *)&finalizeList,
                 (NULLCRef *)((long)&r_1.ptr + 4));
    }
  }
  *marker = OBJECT_FINALIZED | *marker;
  return;
}

Assistant:

void FinalizeObject(markerType& marker, char* base)
	{
		if(marker & NULLC::OBJECT_ARRAY)
		{
			ExternTypeInfo &typeInfo = NULLC::linker->exTypes[(unsigned)marker >> 8];

			unsigned arrayPadding = typeInfo.defaultAlign > 4 ? typeInfo.defaultAlign : 4;

			unsigned count = *(unsigned*)(base + sizeof(markerType) + arrayPadding - 4);
			NULLCRef r = { (unsigned)marker >> 8, base + sizeof(markerType) + arrayPadding }; // skip over marker and array size

			for(unsigned i = 0; i < count; i++)
			{
				NULLC::finalizeList.push_back(r);
				r.ptr += typeInfo.size;
			}
		}
		else
		{
			NULLCRef r = { (unsigned)marker >> 8, base + sizeof(markerType) }; // skip over marker
			NULLC::finalizeList.push_back(r);
		}
		marker |= NULLC::OBJECT_FINALIZED;
	}